

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psquare_suite.cpp
# Opt level: O2

void double_approx_suite::test_count_100(void)

{
  pointer ppVar1;
  long lVar2;
  ostream *poVar3;
  test_result *ptVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  pointer ppVar9;
  pointer ppVar10;
  pointer ppVar11;
  initializer_list<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>
  __l;
  close_to<double> predicate;
  double *in_stack_fffffffffffffe68;
  ulong local_188;
  long local_170;
  ostream *local_160;
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  params;
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  expected;
  parameter_type local_128;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  psquare_median<double> quantile;
  
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::psquare(&quantile);
  local_128.position = 0x14;
  local_128.height = -2.0;
  local_118 = 0x28;
  local_110 = 0x3fe0000000000000;
  local_108 = 0x3c;
  local_100 = (undefined1 *)0x3ff0000000000000;
  local_f8 = 0x50;
  local_f0 = 0x3ff8000000000000;
  local_e8 = 100;
  local_e0 = 0x4010000000000000;
  __l._M_len = 5;
  __l._M_array = &local_128;
  std::
  vector<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ::vector(&expected,__l,(allocator_type *)&params);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameters(&quantile,&expected);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::push(&quantile,1000.0);
  local_128.position =
       (size_type)
       trial::online::quantile::psquare<double,std::ratio<1l,2l>>::get<1ul>
                 ((psquare<double,std::ratio<1l,2l>> *)&quantile);
  params.
  super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_3ff061693c03bc4d;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value()","1.023782","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x36f,0x114785,(char *)&local_128,(double *)&params,in_stack_fffffffffffffe68,
             predicate);
  trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameters(&params,&quantile);
  local_128.position = 0x14;
  local_128.height = -2.0;
  local_118 = 0x29;
  local_110 = 0x3fe251eb851eb852;
  local_108 = 0x3d;
  local_100 = &DAT_3ff061693c03bc4d;
  local_f8 = 0x51;
  local_f0 = 0x4039494d94078961;
  local_e8 = 0x65;
  local_e0 = 0x408f400000000000;
  std::
  vector<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type,std::allocator<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type>>
  ::_M_assign_aux<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type_const*>
            ((vector<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type,std::allocator<trial::online::quantile::psquare<double,std::ratio<1l,2l>>::parameter_type>>
              *)&expected,&local_128);
  local_188 = 0;
  local_160 = (ostream *)&std::cerr;
  lVar5 = 0;
  local_170 = 0;
  ppVar11 = params.
            super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    ppVar1 = expected.
             super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = 0;
    lVar6 = 0;
    while( true ) {
      ppVar9 = (pointer)((long)&ppVar11->position + lVar6);
      ppVar10 = (pointer)((long)&ppVar1->position + lVar6);
      if ((((ppVar9 == params.
                       super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                       ._M_impl.super__Vector_impl_data._M_finish) ||
           (ppVar10 ==
            expected.
            super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
            ._M_impl.super__Vector_impl_data._M_finish)) || (ppVar9->position != ppVar10->position))
         || (1e-05 < ABS(*(double *)((long)&ppVar11->height + lVar6) -
                         *(double *)((long)&ppVar1->height + lVar6)))) break;
      lVar6 = lVar6 + 0x10;
      lVar8 = lVar8 + -1;
    }
    lVar2 = local_170 - lVar8;
    if ((ppVar9 == params.
                   super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                   ._M_impl.super__Vector_impl_data._M_finish) ||
       (ppVar10 ==
        expected.
        super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_001105c0:
      lVar8 = lVar5 - lVar8;
      goto LAB_001105c5;
    }
    if (local_188 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x372);
      poVar3 = std::operator<<(poVar3,"): Container contents differ in function \'");
      poVar3 = std::operator<<(poVar3,"void double_approx_suite::test_count_100()");
      std::operator<<(poVar3,"\':");
    }
    else if (7 < local_188) {
      std::operator<<((ostream *)&std::cerr," ...");
      goto LAB_001105c0;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr," [");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,"]");
    ppVar11 = (pointer)((long)&ppVar11[1].position + lVar6);
    lVar2 = local_170 - lVar8;
    local_170 = lVar2 + 1;
    lVar8 = lVar5 - lVar8;
    lVar5 = lVar8 + 1;
    local_188 = local_188 + 1;
    expected.
    super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)&ppVar1[1].position + lVar6);
  } while (ppVar11 !=
           params.
           super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  ppVar10 = (pointer)((long)&ppVar1[1].position + lVar6);
  lVar8 = lVar8 + 1;
  lVar2 = lVar2 + 1;
  ppVar9 = params.
           super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_001105c5:
  if (((long)params.
             super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 4) + lVar2 !=
      ((long)expected.
             super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10 >> 4) + lVar8) {
    if (local_188 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x372);
      poVar3 = std::operator<<(poVar3,"): Container sizes differ in function \'");
      local_160 = std::operator<<(poVar3,"void double_approx_suite::test_count_100()");
      pcVar7 = "\': size(";
    }
    else {
      pcVar7 = " [*] size(";
    }
    poVar3 = std::operator<<(local_160,pcVar7);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,") != size(");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,")");
    local_188 = local_188 + 1;
  }
  if (local_188 == 0) {
    boost::detail::test_results();
  }
  else {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    ptVar4 = boost::detail::test_results();
    ptVar4->errors_ = ptVar4->errors_ + 1;
  }
  std::
  _Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ::~_Vector_base(&params.
                   super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                 );
  std::
  _Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
  ::~_Vector_base(&expected.
                   super__Vector_base<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type,_std::allocator<trial::online::quantile::psquare<double,_std::ratio<1L,_2L>_>::parameter_type>_>
                 );
  return;
}

Assistant:

void test_count_100()
{
    quantile::psquare_median<double> quantile;
    const double tolerance_threshold = 1e-5;
    const auto tolerance = detail::close_to<double>(tolerance_threshold);
    auto parameter_tolerance =
        [tolerance_threshold]
        (const decltype(quantile)::parameter_type& lhs, const decltype(quantile)::parameter_type& rhs)
        {
            return ((lhs.position == rhs.position) &&
                    std::fabs(lhs.height - rhs.height) <= tolerance_threshold);
        };

    // Approximate normal distribution with expectation 1 and spread 1 after 100 iterations.
    decltype(quantile.parameters()) expected = {
        { 20, -2.0 },
        { 40, 0.5 },
        { 60, 1.0 },
        { 80, 1.5 },
        { 100, 4.0 } };
    quantile.parameters(expected);

    quantile.push(1000.0);
    TRIAL_TEST_WITH(quantile.value(), 1.023782, tolerance);
    auto params = quantile.parameters();
    expected = { {20, -2.0}, {41, 0.5725}, {61, 1.023782}, {81, 25.28634}, {101, 1000.0} };
    TRIAL_TEST_ALL_WITH(params.begin(), params.end(), expected.begin(), expected.end(), parameter_tolerance);
}